

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h
# Opt level: O1

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::Print
          (TPZGeoElRefPattern<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_> *this,ostream *out)

{
  TPZReference *pTVar1;
  
  TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>::Print
            (&this->super_TPZGeoElRefLess<pzgeom::TPZQuadSphere<pzgeom::TPZGeoQuad>_>,out);
  pTVar1 = (this->fRefPattern).fRef;
  if ((pTVar1 != (TPZReference *)0x0) && (pTVar1->fPointer != (TPZRefPattern *)0x0)) {
    TPZRefPattern::ShortPrint(pTVar1->fPointer,out);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + (char)out);
    std::ostream::put((char)out);
    std::ostream::flush();
    return;
  }
  return;
}

Assistant:

void TPZGeoElRefPattern<TGeo>::Print(std::ostream & out)
{
	TPZGeoElRefLess<TGeo>::Print(out);
	
	if(fRefPattern)
	{
		fRefPattern->ShortPrint(out);
		out << std::endl;
	}
}